

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpl_model.c
# Opt level: O2

double get_frame_importance(TplParams *tpl_data,int gf_frame_index)

{
  int iVar1;
  int iVar2;
  TplDepFrame *pTVar3;
  TplDepStats *pTVar4;
  long lVar5;
  long lVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  int iVar10;
  int col;
  int iVar11;
  int iVar12;
  int row;
  int iVar13;
  double local_88;
  undefined1 local_78 [72];
  
  pTVar3 = tpl_data->tpl_frame;
  pTVar4 = pTVar3[gf_frame_index].tpl_stats_ptr;
  iVar1 = pTVar3[gf_frame_index].stride;
  iVar12 = 1 << (tpl_data->tpl_stats_block_mis_log2 & 0x1f);
  local_78._0_16_ = ZEXT816(0);
  local_88 = 1.0;
  for (iVar13 = 0; iVar13 < pTVar3[gf_frame_index].mi_rows; iVar13 = iVar13 + iVar12) {
    iVar11 = 0;
    while( true ) {
      if (pTVar3[gf_frame_index].mi_cols <= iVar11) break;
      iVar10 = (iVar11 >> (tpl_data->tpl_stats_block_mis_log2 & 0x1f)) +
               (iVar13 >> (tpl_data->tpl_stats_block_mis_log2 & 0x1f)) * iVar1;
      dVar7 = (double)pTVar4[iVar10].srcrf_dist;
      iVar2 = pTVar3[gf_frame_index].base_rdmult;
      lVar5 = pTVar4[iVar10].mc_dep_rate;
      lVar6 = pTVar4[iVar10].mc_dep_dist;
      dVar8 = (double)(pTVar4[iVar10].recrf_dist << 7);
      if (dVar8 <= 1.0) {
        dVar8 = 1.0;
      }
      dVar9 = log(dVar8);
      dVar8 = log((double)(lVar6 * 0x80 + (iVar2 * lVar5 + 0x100 >> 9)) + dVar8);
      local_88 = local_88 + dVar7;
      dVar9 = (double)local_78._8_8_ + dVar7 * dVar9;
      local_78._8_4_ = SUB84(dVar9,0);
      local_78._0_8_ = (double)local_78._0_8_ + dVar7 * dVar8;
      local_78._12_4_ = (int)((ulong)dVar9 >> 0x20);
      iVar11 = iVar11 + iVar12;
    }
  }
  dVar7 = exp(((double)local_78._0_8_ - (double)local_78._8_8_) / local_88);
  return dVar7;
}

Assistant:

static double get_frame_importance(const TplParams *tpl_data,
                                   int gf_frame_index) {
  const TplDepFrame *tpl_frame = &tpl_data->tpl_frame[gf_frame_index];
  const TplDepStats *tpl_stats = tpl_frame->tpl_stats_ptr;

  const int tpl_stride = tpl_frame->stride;
  double intra_cost_base = 0;
  double mc_dep_cost_base = 0;
  double cbcmp_base = 1;
  const int step = 1 << tpl_data->tpl_stats_block_mis_log2;

  for (int row = 0; row < tpl_frame->mi_rows; row += step) {
    for (int col = 0; col < tpl_frame->mi_cols; col += step) {
      const TplDepStats *this_stats = &tpl_stats[av1_tpl_ptr_pos(
          row, col, tpl_stride, tpl_data->tpl_stats_block_mis_log2)];
      double cbcmp = (double)this_stats->srcrf_dist;
      const int64_t mc_dep_delta =
          RDCOST(tpl_frame->base_rdmult, this_stats->mc_dep_rate,
                 this_stats->mc_dep_dist);
      double dist_scaled = (double)(this_stats->recrf_dist << RDDIV_BITS);
      dist_scaled = AOMMAX(dist_scaled, 1);
      intra_cost_base += log(dist_scaled) * cbcmp;
      mc_dep_cost_base += log(dist_scaled + mc_dep_delta) * cbcmp;
      cbcmp_base += cbcmp;
    }
  }
  return exp((mc_dep_cost_base - intra_cost_base) / cbcmp_base);
}